

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h262.c
# Opt level: O0

int h262_seqparm(bitstream *str,h262_seqparm *seqparm)

{
  int iVar1;
  int local_34;
  uint local_30;
  int i;
  uint32_t vbv;
  uint32_t br;
  uint32_t vs;
  uint32_t hs;
  h262_seqparm *seqparm_local;
  bitstream *str_local;
  
  br = seqparm->horizontal_size & 0xfff;
  vbv = seqparm->vertical_size & 0xfff;
  i = seqparm->bit_rate & 0x3ffff;
  local_30 = seqparm->vbv_buffer_size & 0x3ff;
  _vs = seqparm;
  seqparm_local = (h262_seqparm *)str;
  if ((str->dir == VS_ENCODE) && (seqparm->is_ext == 0)) {
    if (br != seqparm->horizontal_size) {
      fprintf(_stderr,"horizontal_size too big for MPEG1\n");
      return 1;
    }
    if (vbv != seqparm->vertical_size) {
      fprintf(_stderr,"vertical_size too big for MPEG1\n");
      return 1;
    }
    if (i != seqparm->bit_rate) {
      fprintf(_stderr,"bit_rate too big for MPEG1\n");
      return 1;
    }
    if (local_30 != seqparm->vbv_buffer_size) {
      fprintf(_stderr,"vbv_buffer_size too big for MPEG1\n");
      return 1;
    }
  }
  iVar1 = vs_u(str,&br,0xc);
  if (iVar1 == 0) {
    iVar1 = vs_u((bitstream *)seqparm_local,&vbv,0xc);
    if (iVar1 == 0) {
      iVar1 = vs_u((bitstream *)seqparm_local,&_vs->aspect_ratio_information,4);
      if (iVar1 == 0) {
        iVar1 = vs_u((bitstream *)seqparm_local,&_vs->frame_rate_code,4);
        if (iVar1 == 0) {
          iVar1 = vs_u((bitstream *)seqparm_local,(uint32_t *)&i,0x12);
          if (iVar1 == 0) {
            iVar1 = vs_mark((bitstream *)seqparm_local,1,1);
            if (iVar1 == 0) {
              iVar1 = vs_u((bitstream *)seqparm_local,&local_30,10);
              if (iVar1 == 0) {
                iVar1 = vs_u((bitstream *)seqparm_local,&_vs->constrained_parameters_flag,1);
                if (iVar1 == 0) {
                  iVar1 = vs_u((bitstream *)seqparm_local,&_vs->load_intra_quantiser_matrix,1);
                  if (iVar1 == 0) {
                    if (_vs->load_intra_quantiser_matrix != 0) {
                      for (local_34 = 0; local_34 < 0x40; local_34 = local_34 + 1) {
                        iVar1 = vs_u((bitstream *)seqparm_local,
                                     _vs->intra_quantiser_matrix + local_34,8);
                        if (iVar1 != 0) {
                          return 1;
                        }
                      }
                    }
                    iVar1 = vs_u((bitstream *)seqparm_local,&_vs->load_non_intra_quantiser_matrix,1)
                    ;
                    if (iVar1 == 0) {
                      if (_vs->load_non_intra_quantiser_matrix != 0) {
                        for (local_34 = 0; local_34 < 0x40; local_34 = local_34 + 1) {
                          iVar1 = vs_u((bitstream *)seqparm_local,
                                       _vs->non_intra_quantiser_matrix + local_34,8);
                          if (iVar1 != 0) {
                            return 1;
                          }
                        }
                      }
                      if (seqparm_local->horizontal_size == 1) {
                        _vs->horizontal_size = br;
                        _vs->vertical_size = vbv;
                        _vs->bit_rate = i;
                        _vs->vbv_buffer_size = local_30;
                        _vs->is_ext = 0;
                        _vs->has_disp_ext = 0;
                      }
                      if (_vs->is_ext == 0) {
                        iVar1 = vs_infer((bitstream *)seqparm_local,&_vs->progressive_sequence,1);
                        if (iVar1 != 0) {
                          return 1;
                        }
                        iVar1 = vs_infer((bitstream *)seqparm_local,&_vs->chroma_format,1);
                        if (iVar1 != 0) {
                          return 1;
                        }
                        iVar1 = vs_infer((bitstream *)seqparm_local,&_vs->low_delay,0);
                        if (iVar1 != 0) {
                          return 1;
                        }
                        iVar1 = vs_infer((bitstream *)seqparm_local,&_vs->low_delay,0);
                        if (iVar1 != 0) {
                          return 1;
                        }
                        iVar1 = vs_infer((bitstream *)seqparm_local,&_vs->frame_rate_extension_n,0);
                        if (iVar1 != 0) {
                          return 1;
                        }
                        iVar1 = vs_infer((bitstream *)seqparm_local,&_vs->frame_rate_extension_d,0);
                        if (iVar1 != 0) {
                          return 1;
                        }
                      }
                      str_local._4_4_ = 0;
                    }
                    else {
                      str_local._4_4_ = 1;
                    }
                  }
                  else {
                    str_local._4_4_ = 1;
                  }
                }
                else {
                  str_local._4_4_ = 1;
                }
              }
              else {
                str_local._4_4_ = 1;
              }
            }
            else {
              str_local._4_4_ = 1;
            }
          }
          else {
            str_local._4_4_ = 1;
          }
        }
        else {
          str_local._4_4_ = 1;
        }
      }
      else {
        str_local._4_4_ = 1;
      }
    }
    else {
      str_local._4_4_ = 1;
    }
  }
  else {
    str_local._4_4_ = 1;
  }
  return str_local._4_4_;
}

Assistant:

int h262_seqparm(struct bitstream *str, struct h262_seqparm *seqparm) {
	uint32_t hs = seqparm->horizontal_size & 0xfff;
	uint32_t vs = seqparm->vertical_size & 0xfff;
	uint32_t br = seqparm->bit_rate & 0x3ffff;
	uint32_t vbv = seqparm->vbv_buffer_size & 0x3ff;
	int i;
	if (str->dir == VS_ENCODE && !seqparm->is_ext) {
		if (hs != seqparm->horizontal_size) {
			fprintf(stderr, "horizontal_size too big for MPEG1\n");
			return 1;
		}
		if (vs != seqparm->vertical_size) {
			fprintf(stderr, "vertical_size too big for MPEG1\n");
			return 1;
		}
		if (br != seqparm->bit_rate) {
			fprintf(stderr, "bit_rate too big for MPEG1\n");
			return 1;
		}
		if (vbv != seqparm->vbv_buffer_size) {
			fprintf(stderr, "vbv_buffer_size too big for MPEG1\n");
			return 1;
		}
	}
	if (vs_u(str, &hs, 12)) return 1;
	if (vs_u(str, &vs, 12)) return 1;
	if (vs_u(str, &seqparm->aspect_ratio_information, 4)) return 1;
	if (vs_u(str, &seqparm->frame_rate_code, 4)) return 1;
	if (vs_u(str, &br, 18)) return 1;
	if (vs_mark(str, 1, 1)) return 1;
	if (vs_u(str, &vbv, 10)) return 1;
	if (vs_u(str, &seqparm->constrained_parameters_flag, 1)) return 1;
	if (vs_u(str, &seqparm->load_intra_quantiser_matrix, 1)) return 1;
	if (seqparm->load_intra_quantiser_matrix) {
		for (i = 0; i < 64; i++)
			if (vs_u(str, &seqparm->intra_quantiser_matrix[i], 8)) return 1;
	}
	if (vs_u(str, &seqparm->load_non_intra_quantiser_matrix, 1)) return 1;
	if (seqparm->load_non_intra_quantiser_matrix) {
		for (i = 0; i < 64; i++)
			if (vs_u(str, &seqparm->non_intra_quantiser_matrix[i], 8)) return 1;
	}
	if (str->dir == VS_DECODE) {
		seqparm->horizontal_size = hs;
		seqparm->vertical_size = vs;
		seqparm->bit_rate = br;
		seqparm->vbv_buffer_size = vbv;
		seqparm->is_ext = 0;
		seqparm->has_disp_ext = 0;
	}
	if (!seqparm->is_ext) {
		if (vs_infer(str, &seqparm->progressive_sequence, 1)) return 1;
		if (vs_infer(str, &seqparm->chroma_format, 1)) return 1;
		if (vs_infer(str, &seqparm->low_delay, 0)) return 1;
		if (vs_infer(str, &seqparm->low_delay, 0)) return 1;
		if (vs_infer(str, &seqparm->frame_rate_extension_n, 0)) return 1;
		if (vs_infer(str, &seqparm->frame_rate_extension_d, 0)) return 1;
	}
	return 0;
}